

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementTetraCorot_10.cpp
# Opt level: O1

double __thiscall chrono::fea::ChElementTetraCorot_10::ComputeVolume(ChElementTetraCorot_10 *this)

{
  double dVar1;
  pointer psVar2;
  element_type *peVar3;
  element_type *peVar4;
  undefined1 auVar5 [16];
  double *pdVar6;
  long lVar7;
  Scalar SVar8;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar9 [16];
  ChMatrixDynamic<> M;
  ChVector<double> D1;
  ChVector<double> C1;
  ChVector<double> B1;
  DenseStorage<double,__1,__1,__1,_1> local_98;
  double local_78 [4];
  double local_58 [4];
  double local_38 [4];
  undefined1 local_18 [16];
  
  psVar2 = (this->nodes).
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  peVar3 = (psVar2->super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  peVar4 = psVar2[1].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  local_78[0] = *(double *)((long)&peVar3->super_ChNodeFEAbase + 0x20);
  local_38[0] = *(double *)((long)&peVar4->super_ChNodeFEAbase + 0x20) - local_78[0];
  local_78[1] = *(double *)&peVar3->field_0x28;
  local_38[1] = *(double *)&peVar4->field_0x28 - local_78[1];
  local_78[2] = *(double *)&peVar3->field_0x30;
  local_38[2] = *(double *)&peVar4->field_0x30 - local_78[2];
  peVar3 = psVar2[2].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  local_58[0] = *(double *)((long)&peVar3->super_ChNodeFEAbase + 0x20) - local_78[0];
  local_58[1] = *(double *)&peVar3->field_0x28 - local_78[1];
  local_58[2] = *(double *)&peVar3->field_0x30 - local_78[2];
  peVar3 = psVar2[3].super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  local_78[0] = *(double *)((long)&peVar3->super_ChNodeFEAbase + 0x20) - local_78[0];
  local_78[1] = *(double *)&peVar3->field_0x28 - local_78[1];
  local_78[2] = *(double *)&peVar3->field_0x30 - local_78[2];
  local_98.m_cols = 0;
  local_98.m_data = (double *)0x0;
  local_98.m_rows = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize(&local_98,9,3,3);
  if (local_98.m_rows < 0 && local_98.m_data != (double *)0x0) {
    __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                  ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                  "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, -1, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, -1, 1>, Level = 0]"
                 );
  }
  if (0 < local_98.m_cols) {
    if (local_98.m_rows != 3) {
      __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                    ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                    "void Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, -1, 1>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, -1, 1>]"
                   );
    }
    lVar7 = 0;
    pdVar6 = local_98.m_data;
    do {
      *pdVar6 = local_38[lVar7];
      lVar7 = lVar7 + 1;
      pdVar6 = pdVar6 + local_98.m_cols;
    } while (lVar7 != 3);
    if (1 < local_98.m_cols) {
      pdVar6 = local_98.m_data + 1;
      lVar7 = 0;
      do {
        *pdVar6 = local_58[lVar7];
        lVar7 = lVar7 + 1;
        pdVar6 = pdVar6 + local_98.m_cols;
      } while (lVar7 != 3);
      if (2 < local_98.m_cols) {
        pdVar6 = local_98.m_data + 2;
        lVar7 = 0;
        do {
          *pdVar6 = local_78[lVar7];
          lVar7 = lVar7 + 1;
          pdVar6 = pdVar6 + local_98.m_cols;
        } while (lVar7 != 3);
        Eigen::internal::
        inplace_transpose_selector<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_false,_false>::run
                  ((Matrix<double,__1,__1,_1,__1,__1> *)&local_98);
        SVar8 = Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::determinant
                          ((MatrixBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&local_98);
        auVar9._0_8_ = SVar8 / 6.0;
        auVar9._8_8_ = extraout_XMM0_Qb;
        auVar5._8_8_ = 0x7fffffffffffffff;
        auVar5._0_8_ = 0x7fffffffffffffff;
        local_18 = vandpd_avx512vl(auVar9,auVar5);
        dVar1 = (double)vmovlpd_avx(local_18);
        this->Volume = dVar1;
        if (local_98.m_data != (double *)0x0) {
          free((void *)local_98.m_data[-1]);
        }
        return (double)local_18._0_8_;
      }
    }
  }
  __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x7a,
                "Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, -1, 1>::Block(XprType &, Index) [XprType = Eigen::Matrix<double, -1, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
               );
}

Assistant:

double ChElementTetraCorot_10::ComputeVolume() {
    ChVector<> B1, C1, D1;
    B1.Sub(nodes[1]->pos, nodes[0]->pos);
    C1.Sub(nodes[2]->pos, nodes[0]->pos);
    D1.Sub(nodes[3]->pos, nodes[0]->pos);
    ChMatrixDynamic<> M(3, 3);
    M.col(0) = B1.eigen();
    M.col(1) = C1.eigen();
    M.col(2) = D1.eigen();
    M.transposeInPlace();
    Volume = std::abs(M.determinant() / 6);
    return Volume;
}